

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncTraits.h
# Opt level: O3

int luabridge::detail::
    Invoke<bool,luabridge::detail::TypeList<char_const*,luabridge::detail::TypeList<char_const*,void>>,1>
    ::run<bool(*)(char_const*,char_const*)>(lua_State *L,_func_bool_char_ptr_char_ptr **fn)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = Stack<const_char_*>::get(L,1);
  pcVar3 = Stack<const_char_*>::get(L,2);
  bVar1 = (**fn)(pcVar2,pcVar3);
  lua_pushboolean(L,(uint)bVar1);
  return 1;
}

Assistant:

static int run(lua_State* L, Fn& fn)
    {
        try
        {
            ArgList<Params, startParam> args(L);
            Stack<ReturnType>::push(L, FuncTraits<Fn>::call(fn, args));
            return 1;
        }
        catch (const std::exception& e)
        {
            return luaL_error(L, e.what());
        }
    }